

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher>::MatchExpr
          (MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher> *this,float *arg,
          WithinRelMatcher *matcher,StringRef *matcherString)

{
  int iVar1;
  double local_30;
  StringRef *local_28;
  StringRef *matcherString_local;
  WithinRelMatcher *matcher_local;
  float *arg_local;
  MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher> *this_local;
  
  local_30 = (double)*arg;
  local_28 = matcherString;
  matcherString_local = (StringRef *)matcher;
  matcher_local = (WithinRelMatcher *)arg;
  arg_local = (float *)this;
  iVar1 = (*(matcher->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase
            [3])(matcher,&local_30);
  ITransientExpression::ITransientExpression(&this->super_ITransientExpression,true,SUB41(iVar1,0));
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0040bb50;
  this->m_arg = (float *)matcher_local;
  Matchers::Floating::WithinRelMatcher::WithinRelMatcher
            (&this->m_matcher,(WithinRelMatcher *)matcherString_local);
  (this->m_matcherString).m_start = local_28->m_start;
  (this->m_matcherString).m_size = local_28->m_size;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}